

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

TimingControl * __thiscall slang::ast::CovergroupType::getCoverageEvent(CovergroupType *this)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  byte bVar3;
  int iVar4;
  TimingControl *pTVar5;
  undefined4 extraout_var;
  LookupLocation LVar6;
  ASTContext local_48;
  
  bVar3 = (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged;
  if ((bool)bVar3 == true) {
    return (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
           _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
           _M_value;
  }
  pSVar1 = (this->super_Type).super_Symbol.originatingSyntax;
  if ((pSVar1 == (SyntaxNode *)0x0 || (this->super_Type).super_Symbol.parentScope == (Scope *)0x0)
     || (pSVar1 = pSVar1[5].previewNode, pSVar1 == (SyntaxNode *)0x0)) {
LAB_003683ff:
    if ((bVar3 & 1) == 0) {
      (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
    }
    (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value =
         (TimingControl *)0x0;
    pTVar5 = (TimingControl *)0x0;
  }
  else {
    sVar2 = (this->arguments)._M_extent._M_extent_value;
    if (sVar2 == 0) {
      local_48.lookupIndex = 0;
    }
    else {
      LVar6 = LookupLocation::after((Symbol *)(this->arguments)._M_ptr[sVar2 - 1]);
      local_48.lookupIndex = LVar6.index;
    }
    local_48.scope.ptr = &this->super_Scope;
    local_48.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_48.flags.m_bits = 0;
    local_48.instanceOrProc = (Symbol *)0x0;
    local_48.firstTempVar = (TempVarSymbol *)0x0;
    local_48.randomizeDetails = (RandomizeDetails *)0x0;
    if (pSVar1->kind == EventControlWithExpression) {
      iVar4 = TimingControl::bind((int)pSVar1,(sockaddr *)&local_48,local_48.lookupIndex);
      pTVar5 = (TimingControl *)CONCAT44(extraout_var,iVar4);
    }
    else {
      if (pSVar1->kind != BlockCoverageEvent) {
        bVar3 = (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
                _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>.
                _M_engaged;
        goto LAB_003683ff;
      }
      pTVar5 = BlockEventListControl::fromSyntax
                         ((BlockEventExpressionSyntax *)pSVar1[2].parent,&local_48);
    }
    if ((this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload
        .super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged == false) {
      (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
    }
    (this->event).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
    super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value = pTVar5;
  }
  return pTVar5;
}

Assistant:

const TimingControl* CovergroupType::getCoverageEvent() const {
    if (event)
        return *event;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    if (scope && syntax) {
        if (auto evSyntax = syntax->as<CovergroupDeclarationSyntax>().event) {
            LookupLocation ll = LookupLocation::min;
            if (!arguments.empty())
                ll = LookupLocation::after(*arguments.back());

            ASTContext context(*this, ll);

            if (evSyntax->kind == SyntaxKind::BlockCoverageEvent) {
                event = &BlockEventListControl::fromSyntax(
                    *evSyntax->as<BlockCoverageEventSyntax>().expr, context);
                return *event;
            }
            else if (evSyntax->kind == SyntaxKind::EventControlWithExpression) {
                event = &TimingControl::bind(evSyntax->as<EventControlWithExpressionSyntax>(),
                                             context);
                return *event;
            }
        }
    }

    event = nullptr;
    return nullptr;
}